

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressRleLiteralsBlock(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  int iVar2;
  ulong in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  U32 flSize;
  BYTE *ostart;
  U32 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  uVar1 = (0x1f < in_RCX) + 1 + (uint)(0xfff < in_RCX);
  if (in_RSI < 4) {
    __assert_fail("dstCapacity >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4a4d,
                  "size_t ZSTD_compressRleLiteralsBlock(void *, size_t, const void *, size_t)");
  }
  iVar2 = allBytesIdentical(in_RDI,CONCAT44(uVar1,in_stack_ffffffffffffffd0));
  if (iVar2 != 0) {
    if (uVar1 == 1) {
      *in_RDI = (char)(in_RCX << 3) + '\x01';
    }
    else if (uVar1 == 2) {
      MEM_writeLE16((void *)0x200000002,(U16)(in_stack_ffffffffffffffcc >> 0x10));
    }
    else {
      if (uVar1 != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4a5c,
                      "size_t ZSTD_compressRleLiteralsBlock(void *, size_t, const void *, size_t)");
      }
      MEM_writeLE32((void *)0x300000003,in_stack_ffffffffffffffcc);
    }
    in_RDI[uVar1] = *in_RDX;
    return (ulong)(uVar1 + 1);
  }
  __assert_fail("allBytesIdentical(src, srcSize)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x4a4e,"size_t ZSTD_compressRleLiteralsBlock(void *, size_t, const void *, size_t)"
               );
}

Assistant:

size_t ZSTD_compressRleLiteralsBlock (void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    BYTE* const ostart = (BYTE*)dst;
    U32   const flSize = 1 + (srcSize>31) + (srcSize>4095);

    assert(dstCapacity >= 4); (void)dstCapacity;
    assert(allBytesIdentical(src, srcSize));

    switch(flSize)
    {
        case 1: /* 2 - 1 - 5 */
            ostart[0] = (BYTE)((U32)set_rle + (srcSize<<3));
            break;
        case 2: /* 2 - 2 - 12 */
            MEM_writeLE16(ostart, (U16)((U32)set_rle + (1<<2) + (srcSize<<4)));
            break;
        case 3: /* 2 - 2 - 20 */
            MEM_writeLE32(ostart, (U32)((U32)set_rle + (3<<2) + (srcSize<<4)));
            break;
        default:   /* not necessary : flSize is {1,2,3} */
            assert(0);
    }

    ostart[flSize] = *(const BYTE*)src;
    DEBUGLOG(5, "RLE : Repeated Literal (%02X: %u times) -> %u bytes encoded", ((const BYTE*)src)[0], (U32)srcSize, (U32)flSize + 1);
    return flSize+1;
}